

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

int Fra_ClausSimInfoCheck(Clu_Man_t *p,int *pLits,int nLits)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint *pSims [16];
  long local_98 [17];
  
  if (0 < nLits) {
    iVar1 = p->pCnf->nVars;
    iVar2 = p->nFrames * iVar1;
    uVar3 = 0;
    do {
      uVar5 = (pLits[uVar3] >> 1) - iVar2;
      if ((uVar5 == 0 || pLits[uVar3] >> 1 < iVar2) || (iVar1 <= (int)uVar5)) {
        __assert_fail("iVar > 0 && iVar < p->pCnf->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClaus.c"
                      ,0x427,"int Fra_ClausSimInfoCheck(Clu_Man_t *, int *, int)");
      }
      if (p->vCexes->nSize <= (int)uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      local_98[uVar3] = (long)p->vCexes->pArray[uVar5];
      uVar3 = uVar3 + 1;
    } while ((uint)nLits != uVar3);
  }
  uVar5 = p->nCexes;
  if ((int)uVar5 < 0x20) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)(uVar5 >> 5);
    uVar4 = 0;
    do {
      if (nLits < 1) {
        return 1;
      }
      uVar6 = 0xffffffff;
      uVar7 = 0;
      do {
        uVar6 = uVar6 & ((pLits[uVar7] & 1U) - 1 ^ *(uint *)(local_98[uVar7] + uVar4 * 4));
        uVar7 = uVar7 + 1;
      } while ((uint)nLits != uVar7);
      if (uVar6 != 0) {
        return 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
  }
  if ((uVar5 & 0x1f) != 0) {
    if (nLits < 1) {
      uVar6 = 0xffffffff;
    }
    else {
      uVar6 = 0xffffffff;
      uVar4 = 0;
      do {
        uVar6 = uVar6 & ((pLits[uVar4] & 1U) - 1 ^ *(uint *)(local_98[uVar4] + uVar3 * 4));
        uVar4 = uVar4 + 1;
      } while ((uint)nLits != uVar4);
    }
    if (uVar6 << (-(char)uVar5 & 0x1fU) != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int Fra_ClausSimInfoCheck( Clu_Man_t * p, int * pLits, int nLits )
{
    unsigned * pSims[16], uWord;
    int nWords, iVar, i, w;
    for ( i = 0; i < nLits; i++ )
    {
        iVar = lit_var(pLits[i]) - p->nFrames * p->pCnf->nVars;
        assert( iVar > 0 && iVar < p->pCnf->nVars );
        pSims[i] = (unsigned *)Vec_PtrEntry( p->vCexes, iVar );
    }
    nWords = p->nCexes / 32;
    for ( w = 0; w < nWords; w++ )
    {
        uWord = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            uWord &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
        if ( uWord )
            return 1;
    }
    if ( p->nCexes % 32 )
    {
        uWord = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            uWord &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
        if ( uWord & Abc_InfoMask( p->nCexes % 32 ) )
            return 1;
    }
    return 0;
}